

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

void __thiscall
prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,uchar *args)

{
  size_type sVar1;
  uint uVar2;
  size_t sVar3;
  uchar *puVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  size_type new_size;
  size_type in_stack_00000034;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe0;
  long lVar5;
  difference_type pos;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  
  this_00 = *(prevector<28U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28);
  lVar5 = in_RDI;
  sVar1 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_RSI);
  pos = (difference_type)((ulong)lVar5 >> 0x20);
  uVar2 = sVar1 + 1;
  sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::capacity
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(uVar2,in_stack_ffffffffffffffe0));
  if (sVar3 < uVar2) {
    prevector<28U,_unsigned_char,_unsigned_int,_int>::change_capacity
              (in_stack_00000038,in_stack_00000034);
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::size(in_RSI);
  puVar4 = prevector<28U,_unsigned_char,_unsigned_int,_int>::item_ptr(this_00,pos);
  *puVar4 = (in_RSI->_union).direct[0];
  *(int *)(in_RDI + 0x1c) = *(int *)(in_RDI + 0x1c) + 1;
  if (*(prevector<28U,_unsigned_char,_unsigned_int,_int> **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace_back(Args&&... args) {
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        new(item_ptr(size())) T(std::forward<Args>(args)...);
        _size++;
    }